

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::dumpInteger(Dumper *this,Slice slice)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RSI;
  Dumper *in_RDI;
  int64_t v_2;
  int64_t v_1;
  uint64_t v;
  undefined7 in_stack_ffffffffffffffc8;
  ValueType in_stack_ffffffffffffffcf;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  
  bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isType
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)in_RDI,
                     in_stack_ffffffffffffffcf);
  if (bVar1) {
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUIntUnchecked
              (in_stack_ffffffffffffffd8);
    appendUInt(in_RDI,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  else {
    bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isType
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)in_RDI
                       ,in_stack_ffffffffffffffcf);
    if (bVar1) {
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getIntUnchecked(in_RSI);
      appendInt(in_RDI,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
    else {
      bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isType
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         in_RDI,in_stack_ffffffffffffffcf);
      if (bVar1) {
        lVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                getSmallIntUnchecked(in_stack_ffffffffffffffd8);
        uVar4 = extraout_RDX;
        if (lVar3 < 0) {
          (*in_RDI->_sink->_vptr_Sink[2])(in_RDI->_sink,0x2d);
          lVar3 = -lVar3;
          uVar4 = extraout_RDX_00;
        }
        cVar2 = (char)lVar3 + '0';
        (*in_RDI->_sink->_vptr_Sink[2])(in_RDI->_sink,(ulong)(uint)(int)cVar2,uVar4,cVar2);
      }
    }
  }
  return;
}

Assistant:

void Dumper::dumpInteger(Slice slice) {
  VELOCYPACK_ASSERT(slice.isInteger());

  if (slice.isType(ValueType::UInt)) {
    uint64_t v = slice.getUIntUnchecked();

    appendUInt(v);
  } else if (slice.isType(ValueType::Int)) {
    int64_t v = slice.getIntUnchecked();

    appendInt(v);
  } else if (slice.isType(ValueType::SmallInt)) {
    int64_t v = slice.getSmallIntUnchecked();
    if (v < 0) {
      _sink->push_back('-');
      v = -v;
    }
    _sink->push_back('0' + static_cast<char>(v));
  }
}